

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O0

WeierstrassPoint * ecc_weierstrass_add_general(WeierstrassPoint *P,WeierstrassPoint *Q)

{
  mp_int *pmVar1;
  WeierstrassCurve *Q_00;
  WeierstrassPoint *Q_01;
  uint uVar2;
  uint uVar3;
  uint output_id;
  uint equality;
  uint same_y_coord;
  uint same_x_coord;
  mp_int *lambda_d_tangent;
  mp_int *lambda_n_tangent;
  mp_int *lambda_d;
  mp_int *lambda_n;
  mp_int *denom;
  mp_int *Qx;
  mp_int *Py;
  mp_int *Px;
  WeierstrassPoint *S;
  WeierstrassCurve *wc;
  WeierstrassPoint *Q_local;
  WeierstrassPoint *P_local;
  
  S = (WeierstrassPoint *)P->wc;
  wc = (WeierstrassCurve *)Q;
  Q_local = P;
  if (Q->wc == (WeierstrassCurve *)S) {
    Px = (mp_int *)ecc_weierstrass_point_new_empty((WeierstrassCurve *)S);
    ecc_weierstrass_add_prologue
              (Q_local,(WeierstrassPoint *)wc,&Py,&Qx,&denom,&lambda_n,&lambda_d,&lambda_n_tangent);
    ecc_weierstrass_tangent_slope(Q_local,&lambda_d_tangent,(mp_int **)&same_y_coord);
    uVar2 = mp_eq_integer(lambda_n_tangent,0);
    uVar3 = mp_eq_integer(lambda_d,0);
    mp_select_into(lambda_d,lambda_d,lambda_d_tangent,uVar2 & uVar3);
    mp_select_into(lambda_n_tangent,lambda_n_tangent,_same_y_coord,uVar2 & uVar3);
    ecc_weierstrass_epilogue(Py,denom,Qx,lambda_n,lambda_d,lambda_n_tangent,(WeierstrassPoint *)Px);
    Q_00 = wc;
    pmVar1 = Px;
    uVar2 = mp_eq_integer(Q_local->Z,0);
    ecc_weierstrass_select_into
              ((WeierstrassPoint *)pmVar1,(WeierstrassPoint *)pmVar1,(WeierstrassPoint *)Q_00,uVar2)
    ;
    Q_01 = Q_local;
    pmVar1 = Px;
    uVar2 = mp_eq_integer((mp_int *)wc->sc,0);
    ecc_weierstrass_select_into((WeierstrassPoint *)pmVar1,(WeierstrassPoint *)pmVar1,Q_01,uVar2);
    uVar2 = mp_eq_integer((mp_int *)Px[1].nw,0);
    mp_cond_clear((mp_int *)Px->nw,uVar2);
    mp_cond_clear((mp_int *)Px->w,uVar2);
    mp_free(Py);
    mp_free(Qx);
    mp_free(denom);
    mp_free(lambda_n);
    mp_free(lambda_d);
    mp_free(lambda_n_tangent);
    mp_free(lambda_d_tangent);
    mp_free(_same_y_coord);
    return (WeierstrassPoint *)Px;
  }
  __assert_fail("Q->wc == wc",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-arithmetic.c"
                ,0x184,
                "WeierstrassPoint *ecc_weierstrass_add_general(WeierstrassPoint *, WeierstrassPoint *)"
               );
}

Assistant:

WeierstrassPoint *ecc_weierstrass_add_general(
    WeierstrassPoint *P, WeierstrassPoint *Q)
{
    WeierstrassCurve *wc = P->wc;
    assert(Q->wc == wc);

    WeierstrassPoint *S = ecc_weierstrass_point_new_empty(wc);

    /* Parameters for the epilogue, and slope of the line if P != Q */
    mp_int *Px, *Py, *Qx, *denom, *lambda_n, *lambda_d;
    ecc_weierstrass_add_prologue(
        P, Q, &Px, &Py, &Qx, &denom, &lambda_n, &lambda_d);

    /* Slope if P == Q */
    mp_int *lambda_n_tangent, *lambda_d_tangent;
    ecc_weierstrass_tangent_slope(P, &lambda_n_tangent, &lambda_d_tangent);

    /* Select between those slopes depending on whether P == Q */
    unsigned same_x_coord = mp_eq_integer(lambda_d, 0);
    unsigned same_y_coord = mp_eq_integer(lambda_n, 0);
    unsigned equality = same_x_coord & same_y_coord;
    mp_select_into(lambda_n, lambda_n, lambda_n_tangent, equality);
    mp_select_into(lambda_d, lambda_d, lambda_d_tangent, equality);

    /* Now go to the common code between addition and doubling */
    ecc_weierstrass_epilogue(Px, Qx, Py, denom, lambda_n, lambda_d, S);

    /* Check for the input identity cases, and overwrite the output if
     * necessary. */
    ecc_weierstrass_select_into(S, S, Q, mp_eq_integer(P->Z, 0));
    ecc_weierstrass_select_into(S, S, P, mp_eq_integer(Q->Z, 0));

    /*
     * In the case where P == -Q and so the output is the identity,
     * we'll have calculated lambda_d = 0 and so the output will have
     * z==0 already. Detect that and use it to normalise the other two
     * coordinates to zero.
     */
    unsigned output_id = mp_eq_integer(S->Z, 0);
    mp_cond_clear(S->X, output_id);
    mp_cond_clear(S->Y, output_id);

    mp_free(Px);
    mp_free(Py);
    mp_free(Qx);
    mp_free(denom);
    mp_free(lambda_n);
    mp_free(lambda_d);
    mp_free(lambda_n_tangent);
    mp_free(lambda_d_tangent);

    return S;
}